

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O0

void duckdb::AggregateExecutor::
     UnaryFlatLoop<duckdb::ModeState<double,duckdb::ModeStandard<double>>,double,duckdb::EntropyFunction<duckdb::ModeStandard<double>>>
               (double *idata,AggregateInputData *aggr_input_data,
               ModeState<double,_duckdb::ModeStandard<double>_> **states,ValidityMask *mask,
               idx_t count)

{
  bool bVar1;
  TemplatedValidityMask<unsigned_long> *in_RCX;
  AggregateInputData *in_RSI;
  double in_R8;
  idx_t *i;
  AggregateUnaryInput input_1;
  idx_t start;
  idx_t next;
  unsigned_long validity_entry;
  idx_t entry_idx;
  idx_t entry_count;
  idx_t *base_idx;
  AggregateUnaryInput input;
  double *in_stack_ffffffffffffff68;
  double *key;
  ModeState<double,_duckdb::ModeStandard<double>_> *in_stack_ffffffffffffff70;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffff78;
  double local_80;
  idx_t local_78;
  ulong local_70;
  ulong local_68;
  unsigned_long local_60;
  ulong local_58;
  ulong local_50;
  idx_t *local_48;
  AggregateUnaryInput local_40;
  double local_28;
  TemplatedValidityMask<unsigned_long> *local_20;
  AggregateInputData *local_10;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_10 = in_RSI;
  bVar1 = BaseModeFunction<duckdb::ModeStandard<double>_>::IgnoreNull();
  if ((!bVar1) || (bVar1 = TemplatedValidityMask<unsigned_long>::AllValid(local_20), bVar1)) {
    AggregateUnaryInput::AggregateUnaryInput
              ((AggregateUnaryInput *)&stack0xffffffffffffff70,local_10,(ValidityMask *)local_20);
    key = &local_80;
    local_80 = 0.0;
    while ((ulong)*key < (ulong)local_28) {
      BaseModeFunction<duckdb::ModeStandard<double>>::
      Operation<double,duckdb::ModeState<double,duckdb::ModeStandard<double>>,duckdb::EntropyFunction<duckdb::ModeStandard<double>>>
                (in_stack_ffffffffffffff70,key,(AggregateUnaryInput *)0xb3e5c8);
      *key = (double)((long)*key + 1);
    }
  }
  else {
    AggregateUnaryInput::AggregateUnaryInput(&local_40,local_10,(ValidityMask *)local_20);
    local_48 = &local_40.input_idx;
    local_40.input_idx = 0;
    local_50 = TemplatedValidityMask<unsigned_long>::EntryCount(0xb3e3d4);
    for (local_58 = 0; local_58 < local_50; local_58 = local_58 + 1) {
      local_60 = TemplatedValidityMask<unsigned_long>::GetValidityEntry
                           (in_stack_ffffffffffffff78,(idx_t)in_stack_ffffffffffffff70);
      local_68 = MinValue<unsigned_long>(*local_48 + 0x40,(unsigned_long)local_28);
      bVar1 = TemplatedValidityMask<unsigned_long>::AllValid(local_60);
      if (bVar1) {
        while (*local_48 < local_68) {
          BaseModeFunction<duckdb::ModeStandard<double>>::
          Operation<double,duckdb::ModeState<double,duckdb::ModeStandard<double>>,duckdb::EntropyFunction<duckdb::ModeStandard<double>>>
                    (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                     (AggregateUnaryInput *)0xb3e477);
          *local_48 = *local_48 + 1;
        }
      }
      else {
        bVar1 = TemplatedValidityMask<unsigned_long>::NoneValid(local_60);
        if (bVar1) {
          *local_48 = local_68;
        }
        else {
          local_70 = *local_48;
          while (*local_48 < local_68) {
            local_78 = *local_48 - local_70;
            bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid(&local_60,&local_78);
            if (bVar1) {
              BaseModeFunction<duckdb::ModeStandard<double>>::
              Operation<double,duckdb::ModeState<double,duckdb::ModeStandard<double>>,duckdb::EntropyFunction<duckdb::ModeStandard<double>>>
                        (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                         (AggregateUnaryInput *)0xb3e527);
            }
            *local_48 = *local_48 + 1;
          }
        }
      }
    }
  }
  return;
}

Assistant:

static inline void UnaryFlatLoop(const INPUT_TYPE *__restrict idata, AggregateInputData &aggr_input_data,
	                                 STATE_TYPE **__restrict states, ValidityMask &mask, idx_t count) {
		if (OP::IgnoreNull() && !mask.AllValid()) {
			AggregateUnaryInput input(aggr_input_data, mask);
			auto &base_idx = input.input_idx;
			base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*states[base_idx], idata[base_idx], input);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*states[base_idx], idata[base_idx],
							                                                   input);
						}
					}
				}
			}
		} else {
			AggregateUnaryInput input(aggr_input_data, mask);
			auto &i = input.input_idx;
			for (i = 0; i < count; i++) {
				OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*states[i], idata[i], input);
			}
		}
	}